

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

int __thiscall
QFontDatabasePrivate::addAppFont(QFontDatabasePrivate *this,QByteArray *fontData,QString *fileName)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  qsizetype qVar4;
  QLatin1String *a;
  QPlatformIntegration *pQVar5;
  undefined4 extraout_var;
  QString *in_RDX;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QPlatformFontDatabase *platformFontDatabase;
  int i;
  ApplicationFont font;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  QCache<QtFontFallbacksCacheKey,_QList<QString>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffec0;
  int local_11c;
  undefined1 local_118 [24];
  undefined1 local_100 [24];
  QLatin1StringView local_e8;
  undefined1 local_98 [72];
  QString local_50;
  QByteArray aQStack_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_50,0xaa,0x48);
  ApplicationFont::ApplicationFont((ApplicationFont *)in_stack_fffffffffffffe90);
  QByteArray::operator=(aQStack_38,in_RSI);
  QString::operator=(&local_50,in_RDX);
  for (local_11c = 0; lVar3 = (long)local_11c,
      qVar4 = QList<QFontDatabasePrivate::ApplicationFont>::size
                        ((QList<QFontDatabasePrivate::ApplicationFont> *)(in_RDI + 0x68)),
      lVar3 < qVar4; local_11c = local_11c + 1) {
    QList<QFontDatabasePrivate::ApplicationFont>::at
              ((QList<QFontDatabasePrivate::ApplicationFont> *)in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    bVar1 = ApplicationFont::isNull((ApplicationFont *)0x7466f1);
    if (bVar1) break;
  }
  a = (QLatin1String *)(long)local_11c;
  qVar4 = QList<QFontDatabasePrivate::ApplicationFont>::size
                    ((QList<QFontDatabasePrivate::ApplicationFont> *)(in_RDI + 0x68));
  if (qVar4 <= (long)a) {
    in_stack_fffffffffffffe90 = (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *)(in_RDI + 0x68);
    memset(local_98,0,0x48);
    ApplicationFont::ApplicationFont((ApplicationFont *)in_stack_fffffffffffffe90);
    QList<QFontDatabasePrivate::ApplicationFont>::append
              ((QList<QFontDatabasePrivate::ApplicationFont> *)in_stack_fffffffffffffe90,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ApplicationFont::~ApplicationFont((ApplicationFont *)in_stack_fffffffffffffe90);
    qVar4 = QList<QFontDatabasePrivate::ApplicationFont>::size
                      ((QList<QFontDatabasePrivate::ApplicationFont> *)(in_RDI + 0x68));
    local_11c = (int)qVar4 + -1;
  }
  bVar1 = QString::isEmpty((QString *)0x74679e);
  if ((bVar1) && (bVar1 = QByteArray::isEmpty((QByteArray *)0x7467b1), !bVar1)) {
    local_e8 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)a,(size_t)in_stack_fffffffffffffe90);
    QString::number((int)local_100,local_11c);
    ::operator+(a,(QString *)in_stack_fffffffffffffe90);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String,_QString> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QString::operator=((QString *)in_stack_fffffffffffffe90,
                       (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QString::~QString((QString *)0x74683e);
    QStringBuilder<QLatin1String,_QString>::~QStringBuilder
              ((QStringBuilder<QLatin1String,_QString> *)0x74684b);
    QString::~QString((QString *)0x746855);
  }
  pQVar5 = QGuiApplicationPrivate::platformIntegration();
  iVar2 = (*pQVar5->_vptr_QPlatformIntegration[0xd])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
            (local_118,(long *)CONCAT44(extraout_var,iVar2),aQStack_38,&local_50,&local_50);
  QList<QString>::~QList((QList<QString> *)0x74689e);
  bVar1 = QList<QFontDatabasePrivate::ApplicationFont::Properties>::isEmpty
                    ((QList<QFontDatabasePrivate::ApplicationFont::Properties> *)0x7468af);
  if (bVar1) {
    local_11c = -1;
  }
  else {
    QList<QFontDatabasePrivate::ApplicationFont>::operator[]
              ((QList<QFontDatabasePrivate::ApplicationFont> *)in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ApplicationFont::operator=
              ((ApplicationFont *)in_stack_fffffffffffffe90,
               (ApplicationFont *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QFontCache::instance();
    QFontCache::clear((QFontCache *)CONCAT44(local_11c,in_stack_fffffffffffffec0));
    QCache<QtFontFallbacksCacheKey,_QList<QString>_>::clear(in_stack_fffffffffffffe90);
    QCoreApplication::instance();
    QGuiApplication::fontDatabaseChanged((QGuiApplication *)0x746912);
  }
  ApplicationFont::~ApplicationFont((ApplicationFont *)in_stack_fffffffffffffe90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_11c;
}

Assistant:

int QFontDatabasePrivate::addAppFont(const QByteArray &fontData, const QString &fileName)
{
    QFontDatabasePrivate::ApplicationFont font;
    font.data = fontData;
    font.fileName = fileName;

    Q_TRACE(QFontDatabasePrivate_addAppFont, fileName);

    int i;
    for (i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).isNull())
            break;
    if (i >= applicationFonts.size()) {
        applicationFonts.append(ApplicationFont());
        i = applicationFonts.size() - 1;
    }

    if (font.fileName.isEmpty() && !fontData.isEmpty())
        font.fileName = ":qmemoryfonts/"_L1 + QString::number(i);

    auto *platformFontDatabase = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    platformFontDatabase->addApplicationFont(font.data, font.fileName, &font);
    if (font.properties.isEmpty())
        return -1;

    applicationFonts[i] = font;

    // The font cache may have cached lookups for the font that was now
    // loaded, so it has to be flushed.
    QFontCache::instance()->clear();

    fallbacksCache.clear();

    emit qApp->fontDatabaseChanged();

    return i;
}